

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O2

ParseResult * __thiscall
cmArgumentParser<void>::
Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (ParseResult *__return_storage_ptr__,cmArgumentParser<void> *this,
          MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *args,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *unparsedArguments,size_t pos)

{
  _Rb_tree_header *p_Var1;
  Instance local_78;
  
  p_Var1 = &(__return_storage_ptr__->KeywordErrors)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->KeywordErrors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->KeywordErrors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->KeywordErrors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->KeywordErrors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->KeywordErrors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78.Result = (void *)0x0;
  local_78.Keyword._M_len = 0;
  local_78.Keyword._M_str = (char *)0x0;
  local_78.KeywordValuesSeen = 0;
  local_78.KeywordValuesExpected = 0;
  local_78.KeywordValueFunc.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_78.KeywordValueFunc.super__Function_base._M_functor._8_8_ = 0;
  local_78.KeywordValueFunc.super__Function_base._M_manager._0_1_ = 0;
  local_78.KeywordValueFunc.super__Function_base._M_manager._1_7_ = 0;
  local_78.KeywordValueFunc._M_invoker._0_1_ = 0;
  local_78._89_8_ = 0;
  local_78.Bindings = (ActionMap *)this;
  local_78.ParseResults = __return_storage_ptr__;
  local_78.UnparsedArguments = unparsedArguments;
  ArgumentParser::Instance::
  Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_78,args,pos);
  std::_Function_base::~_Function_base(&local_78.KeywordValueFunc.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

ParseResult Parse(Range const& args,
                    std::vector<std::string>* unparsedArguments,
                    std::size_t pos = 0) const
  {
    ParseResult parseResult;
    Instance instance(this->Bindings, &parseResult, unparsedArguments);
    instance.Parse(args, pos);
    return parseResult;
  }